

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O2

zip_source_t * source_hole_create(char *fname,int flags,zip_error_t *error)

{
  void *__ptr;
  char *pcVar1;
  buffer_t *buffer;
  FILE *__stream;
  size_t sVar2;
  zip_uint64_t zVar3;
  zip_uint64_t zVar4;
  zip_uint8_t **ppzVar5;
  ulong uVar6;
  zip_source_t *pzVar7;
  zip_uint8_t *pzVar8;
  int *piVar9;
  int iVar10;
  undefined8 uVar11;
  int local_48;
  zip_uint8_t local_44 [8];
  zip_uint8_t local_3c [12];
  
  __ptr = malloc(0x28);
  if (__ptr == (void *)0x0) {
LAB_00106dfc:
    zip_error_set(error,0xe,0);
    return (zip_source_t *)0x0;
  }
  pcVar1 = strdup(fname);
  *(char **)((long)__ptr + 0x10) = pcVar1;
  if (pcVar1 == (char *)0x0) {
    free(__ptr);
    goto LAB_00106dfc;
  }
  buffer = buffer_new();
  if (buffer == (buffer_t *)0x0) {
    zip_error_set(error,0xe,0);
    goto LAB_00106f3c;
  }
  if ((flags & 8U) != 0) {
LAB_00106e30:
    *(buffer_t **)((long)__ptr + 0x18) = buffer;
    zip_error_init(__ptr);
    *(undefined8 *)((long)__ptr + 0x20) = 0;
    pzVar7 = (zip_source_t *)zip_source_function_create(source_hole_cb,__ptr,error);
    return pzVar7;
  }
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    piVar9 = __errno_location();
    if (((flags & 1U) == 0) || (*piVar9 != 2)) {
      buffer_free(buffer);
      goto LAB_00106f3c;
    }
    goto LAB_00106e30;
  }
  sVar2 = fread(&local_48,0x14,1,__stream);
  if (sVar2 == 1) {
    if (local_48 != 0x3048694e) {
LAB_00106f14:
      iVar10 = 0x16;
      goto LAB_00106f1a;
    }
    zVar3 = get_u64(local_44);
    buffer->fragment_size = zVar3;
    zVar4 = get_u64(local_3c);
    buffer->size = zVar4;
    if (!CARRY8(zVar4,zVar3)) {
      zVar3 = ((zVar4 + zVar3) - 1) / zVar3;
      buffer->nfragments = zVar3;
      if (zVar3 >> 0x3d == 0) {
        ppzVar5 = (zip_uint8_t **)malloc(zVar3 * 8);
        buffer->fragment = ppzVar5;
        if (ppzVar5 != (zip_uint8_t **)0x0) {
          for (uVar6 = 0; uVar6 < zVar3; uVar6 = uVar6 + 1) {
            buffer->fragment[uVar6] = (zip_uint8_t *)0x0;
          }
          uVar6 = 0;
          while (uVar6 < zVar3) {
            sVar2 = fread(&local_48,4,1,__stream);
            if (sVar2 != 1) goto LAB_00106f08;
            if (local_48 == 0x3248694e) {
              sVar2 = fread(&local_48,8,1,__stream);
              if (sVar2 != 1) goto LAB_00106f08;
              zVar3 = get_u64((zip_uint8_t *)&local_48);
              uVar6 = uVar6 + zVar3;
            }
            else {
              if (local_48 != 0x3148694e) goto LAB_00106f14;
              sVar2 = buffer->fragment_size;
              pzVar8 = (zip_uint8_t *)malloc(sVar2);
              buffer->fragment[uVar6] = pzVar8;
              if (pzVar8 == (zip_uint8_t *)0x0) goto LAB_00106f1f;
              sVar2 = fread(buffer->fragment[uVar6],sVar2,1,__stream);
              if (sVar2 != 1) goto LAB_00106f08;
              uVar6 = uVar6 + 1;
            }
            zVar3 = buffer->nfragments;
          }
          fclose(__stream);
          goto LAB_00106e30;
        }
      }
    }
LAB_00106f1f:
    uVar11 = 0xe;
    iVar10 = 0;
  }
  else {
LAB_00106f08:
    piVar9 = __errno_location();
    iVar10 = *piVar9;
LAB_00106f1a:
    uVar11 = 5;
  }
  zip_error_set(error,uVar11,iVar10);
  buffer_free(buffer);
  fclose(__stream);
LAB_00106f3c:
  free(__ptr);
  return (zip_source_t *)0x0;
}

Assistant:

zip_source_t *
source_hole_create(const char *fname, int flags, zip_error_t *error) {
    hole_t *ud = hole_new(fname, flags, error);

    if (ud == NULL) {
	return NULL;
    }
    return zip_source_function_create(source_hole_cb, ud, error);
}